

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

void __kmp_dispatch_finish_chunk<unsigned_int>(int gtid,ident_t *loc)

{
  int iVar1;
  kmp_info_t *pkVar2;
  dispatch_private_info_t *pdVar3;
  dispatch_shared_info_t *pdVar4;
  int iVar5;
  void *in_RSI;
  int in_EDI;
  uint inc;
  uint upper;
  uint lower;
  dispatch_shared_info_template<unsigned_int> *sh;
  dispatch_private_info_template<unsigned_int> *pr;
  kmp_info_t *th;
  undefined4 in_stack_fffffffffffffff8;
  
  pkVar2 = __kmp_threads[in_EDI];
  if ((((pkVar2->th).th_team)->t).t_serialized == 0) {
    pdVar3 = ((pkVar2->th).th_dispatch)->th_dispatch_pr_current;
    pdVar4 = ((pkVar2->th).th_dispatch)->th_dispatch_sh_current;
    iVar5 = ((pdVar3->u).p32.ordered_upper - (pdVar3->u).p32.ordered_lower) + 1;
    if (pdVar3->ordered_bumped == iVar5) {
      pdVar3->ordered_bumped = 0;
    }
    else {
      iVar1 = pdVar3->ordered_bumped;
      __kmp_wait<unsigned_int>
                (_upper,inc,(_func_kmp_uint32_uint_uint *)CONCAT44(in_EDI,in_stack_fffffffffffffff8)
                 ,in_RSI);
      pdVar3->ordered_bumped = 0;
      test_then_add<int>((kmp_int32 *)&(pdVar4->u).s32.ordered_iteration,iVar5 - iVar1);
    }
  }
  return;
}

Assistant:

static void __kmp_dispatch_finish_chunk(int gtid, ident_t *loc) {
  typedef typename traits_t<UT>::signed_t ST;
  kmp_info_t *th = __kmp_threads[gtid];

  KD_TRACE(100, ("__kmp_dispatch_finish_chunk: T#%d called\n", gtid));
  if (!th->th.th_team->t.t_serialized) {
    //        int cid;
    dispatch_private_info_template<UT> *pr =
        reinterpret_cast<dispatch_private_info_template<UT> *>(
            th->th.th_dispatch->th_dispatch_pr_current);
    dispatch_shared_info_template<UT> volatile *sh =
        reinterpret_cast<dispatch_shared_info_template<UT> volatile *>(
            th->th.th_dispatch->th_dispatch_sh_current);
    KMP_DEBUG_ASSERT(pr);
    KMP_DEBUG_ASSERT(sh);
    KMP_DEBUG_ASSERT(th->th.th_dispatch ==
                     &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid]);

    //        for (cid = 0; cid < KMP_MAX_ORDERED; ++cid) {
    UT lower = pr->u.p.ordered_lower;
    UT upper = pr->u.p.ordered_upper;
    UT inc = upper - lower + 1;

    if (pr->ordered_bumped == inc) {
      KD_TRACE(
          1000,
          ("__kmp_dispatch_finish: T#%d resetting ordered_bumped to zero\n",
           gtid));
      pr->ordered_bumped = 0;
    } else {
      inc -= pr->ordered_bumped;

#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_finish_chunk: T#%%d before wait: "
            "ordered_iteration:%%%s lower:%%%s upper:%%%s\n",
            traits_t<UT>::spec, traits_t<UT>::spec, traits_t<UT>::spec);
        KD_TRACE(1000, (buff, gtid, sh->u.s.ordered_iteration, lower, upper));
        __kmp_str_free(&buff);
      }
#endif

      __kmp_wait<UT>(&sh->u.s.ordered_iteration, lower,
                     __kmp_ge<UT> USE_ITT_BUILD_ARG(NULL));

      KMP_MB(); /* is this necessary? */
      KD_TRACE(1000, ("__kmp_dispatch_finish_chunk: T#%d resetting "
                      "ordered_bumped to zero\n",
                      gtid));
      pr->ordered_bumped = 0;
//!!!!! TODO check if the inc should be unsigned, or signed???
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_finish_chunk: T#%%d after wait: "
            "ordered_iteration:%%%s inc:%%%s lower:%%%s upper:%%%s\n",
            traits_t<UT>::spec, traits_t<UT>::spec, traits_t<UT>::spec,
            traits_t<UT>::spec);
        KD_TRACE(1000,
                 (buff, gtid, sh->u.s.ordered_iteration, inc, lower, upper));
        __kmp_str_free(&buff);
      }
#endif

      test_then_add<ST>((volatile ST *)&sh->u.s.ordered_iteration, inc);
    }
    //        }
  }
  KD_TRACE(100, ("__kmp_dispatch_finish_chunk: T#%d returned\n", gtid));
}